

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLElement::~XMLElement(XMLElement *this)

{
  XMLElement *this_local;
  
  ~XMLElement(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

XMLElement::~XMLElement()
{
    while (_rootAttribute) {
        XMLAttribute* next = _rootAttribute->_next;
        DeleteAttribute(_rootAttribute);
        _rootAttribute = next;
    }
}